

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O3

int64_t JS_FlattenIntoArray(JSContext *ctx,JSValue target,JSValue source,int64_t sourceLen,
                           int64_t targetIndex,int depth,JSValue mapperFunction,JSValue thisArg)

{
  JSValue new_target;
  int iVar1;
  uint uVar2;
  ulong targetIndex_00;
  JSValueUnion JVar3;
  JSContext *pJVar4;
  uintptr_t sp;
  int64_t iVar5;
  JSValueUnion idx;
  bool bVar6;
  JSValue v;
  JSValue v_00;
  JSValue target_00;
  JSValue v_01;
  JSValue this_obj;
  JSValue v_02;
  JSValue JVar7;
  JSValue source_00;
  JSValue prop;
  JSValue obj;
  uint uStack_cc;
  int64_t local_c0;
  int64_t elementLen;
  ulong local_b0;
  JSValueUnion local_a8;
  int64_t iStack_a0;
  JSValueUnion local_98;
  int64_t local_90;
  JSValueUnion local_88;
  int64_t local_80;
  int64_t local_78;
  int64_t local_70;
  JSValueUnion local_68;
  JSContext *local_60;
  JSValueUnion local_58;
  int64_t iStack_50;
  JSValueUnion local_48;
  int64_t local_40;
  JSValueUnion local_38;
  
  local_78 = source.tag;
  local_48 = source.u;
  local_70 = target.tag;
  local_68 = target.u;
  if (&stack0xfffffffffffffff8 < (undefined1 *)ctx->rt->stack_limit) {
    JS_ThrowInternalError(ctx,"stack overflow");
    targetIndex = -1;
  }
  else if (0 < sourceLen) {
    elementLen = mapperFunction.tag & 0xffffffff;
    local_b0 = (ulong)(depth - 1);
    idx.float64 = 0.0;
    targetIndex_00 = targetIndex;
    while( true ) {
      JVar7.tag = local_78;
      JVar7.u.float64 = local_48.float64;
      iVar1 = JS_TryGetPropertyInt64(ctx,JVar7,(int64_t)idx,(JSValue *)&local_58);
      targetIndex = -1;
      if (iVar1 < 0) break;
      if (iVar1 != 0) {
        if ((int)elementLen != 3) {
          local_a8 = local_58;
          iStack_a0 = iStack_50;
          local_98.float64 = (double)idx.float64;
          if ((ulong)idx.ptr >> 0x1f == 0) {
            local_90 = 0;
            local_98 = idx;
          }
          else {
            local_90 = 7;
          }
          local_88.float64 = local_48.float64;
          local_80 = local_78;
          new_target.tag = 3;
          new_target.u.ptr = (void *)((ulong)uStack_cc << 0x20);
          local_38 = (JSValueUnion)sourceLen;
          JVar7 = JS_CallInternal(ctx,mapperFunction,thisArg,new_target,3,(JSValue *)&local_a8,2);
          _local_58 = JVar7;
          if ((0xfffffff4 < (uint)iStack_a0) &&
             (iVar1 = *local_a8.ptr, *(int *)local_a8.ptr = iVar1 + -1, iVar1 < 2)) {
            v.tag = iStack_a0;
            v.u.ptr = local_a8.ptr;
            __JS_FreeValueRT(ctx->rt,v);
          }
          if ((0xfffffff4 < (uint)local_90) &&
             (iVar1 = *local_98.ptr, *(int *)local_98.ptr = iVar1 + -1, iVar1 < 2)) {
            v_00.tag = local_90;
            v_00.u.float64 = local_98.float64;
            __JS_FreeValueRT(ctx->rt,v_00);
          }
          sourceLen = (int64_t)local_38;
          if ((int)JVar7.tag == 6) {
            return -1;
          }
        }
        pJVar4 = ctx;
        if ((0 < depth) && (local_58._8_4_ == -1)) {
          if (*(short *)((long)local_58.ptr + 6) == 0x29) {
            local_40 = iStack_50;
            local_38.float64 = local_58.float64;
            uVar2 = js_proxy_isArray(ctx,_local_58);
            iVar5 = local_40;
            JVar3 = local_38;
            if ((int)uVar2 < 0) goto LAB_00164803;
          }
          else {
            uVar2 = (uint)(*(short *)((long)local_58.ptr + 6) == 2);
            iVar5 = iStack_50;
            JVar3 = local_58;
          }
          if (uVar2 != 0) {
            obj.tag = iVar5;
            obj.u.ptr = JVar3.ptr;
            local_60 = ctx;
            local_40 = iVar5;
            local_38 = JVar3;
            iVar1 = js_get_length64(ctx,&local_c0,obj);
            iVar5 = local_40;
            pJVar4 = local_60;
            JVar3 = local_38;
            if ((iVar1 < 0) ||
               (target_00.tag = local_70, target_00.u.ptr = local_68.ptr, source_00.tag = local_40,
               source_00.u.ptr = local_38.ptr,
               targetIndex_00 =
                    JS_FlattenIntoArray(local_60,target_00,source_00,local_c0,targetIndex_00,
                                        (int)local_b0,(JSValue)(ZEXT816(3) << 0x40),
                                        (JSValue)(ZEXT816(3) << 0x40)), iVar5 = local_40,
               pJVar4 = ctx, JVar3 = local_38, (long)targetIndex_00 < 0)) goto LAB_00164803;
            iVar1 = *local_38.ptr;
            *(int *)local_38.ptr = iVar1 + -1;
            if (iVar1 < 2) {
              v_01.tag = local_40;
              v_01.u.ptr = local_38.ptr;
              __JS_FreeValueRT(ctx->rt,v_01);
            }
            goto LAB_0016478b;
          }
        }
        if (0x1ffffffffffffe < (long)targetIndex_00) {
          JS_ThrowTypeError(ctx,"Array too long");
          iVar5 = iStack_50;
          JVar3 = local_58;
LAB_00164803:
          if ((uint)iVar5 < 0xfffffff5) {
            return -1;
          }
          iVar1 = *JVar3.ptr;
          *(int *)JVar3.ptr = iVar1 + -1;
          if (1 < iVar1) {
            return -1;
          }
          v_02.tag = iVar5;
          v_02.u.ptr = JVar3.ptr;
          __JS_FreeValueRT(pJVar4->rt,v_02);
          return -1;
        }
        bVar6 = (long)(int)targetIndex_00 == targetIndex_00;
        JVar3.float64 = (double)(long)targetIndex_00;
        if (bVar6) {
          JVar3.ptr = (void *)(targetIndex_00 & 0xffffffff);
        }
        local_a8 = local_58;
        iStack_a0 = iStack_50;
        iVar5 = 7;
        if (bVar6) {
          iVar5 = 0;
        }
        this_obj.tag = local_70;
        this_obj.u.ptr = local_68.ptr;
        prop.tag = iVar5;
        prop.u.float64 = JVar3.float64;
        iVar1 = JS_DefinePropertyValueValue(ctx,this_obj,prop,_local_58,0x4007);
        if (iVar1 < 0) {
          return -1;
        }
        targetIndex_00 = targetIndex_00 + 1;
      }
LAB_0016478b:
      idx.float64 = idx.float64 + 1;
      if ((void *)sourceLen == idx.ptr) {
        return targetIndex_00;
      }
    }
  }
  return targetIndex;
}

Assistant:

static int64_t JS_FlattenIntoArray(JSContext *ctx, JSValueConst target,
                                   JSValueConst source, int64_t sourceLen,
                                   int64_t targetIndex, int depth,
                                   JSValueConst mapperFunction,
                                   JSValueConst thisArg)
{
    JSValue element;
    int64_t sourceIndex, elementLen;
    int present, is_array;

    if (js_check_stack_overflow(ctx->rt, 0)) {
        JS_ThrowStackOverflow(ctx);
        return -1;
    }

    for (sourceIndex = 0; sourceIndex < sourceLen; sourceIndex++) {
        present = JS_TryGetPropertyInt64(ctx, source, sourceIndex, &element);
        if (present < 0)
            return -1;
        if (!present)
            continue;
        if (!JS_IsUndefined(mapperFunction)) {
            JSValueConst args[3] = { element, JS_NewInt64(ctx, sourceIndex), source };
            element = JS_Call(ctx, mapperFunction, thisArg, 3, args);
            JS_FreeValue(ctx, (JSValue)args[0]);
            JS_FreeValue(ctx, (JSValue)args[1]);
            if (JS_IsException(element))
                return -1;
        }
        if (depth > 0) {
            is_array = JS_IsArray(ctx, element);
            if (is_array < 0)
                goto fail;
            if (is_array) {
                if (js_get_length64(ctx, &elementLen, element) < 0)
                    goto fail;
                targetIndex = JS_FlattenIntoArray(ctx, target, element,
                                                  elementLen, targetIndex,
                                                  depth - 1,
                                                  JS_UNDEFINED, JS_UNDEFINED);
                if (targetIndex < 0)
                    goto fail;
                JS_FreeValue(ctx, element);
                continue;
            }
        }
        if (targetIndex >= MAX_SAFE_INTEGER) {
            JS_ThrowTypeError(ctx, "Array too long");
            goto fail;
        }
        if (JS_DefinePropertyValueInt64(ctx, target, targetIndex, element,
                                        JS_PROP_C_W_E | JS_PROP_THROW) < 0)
            return -1;
        targetIndex++;
    }
    return targetIndex;

fail:
    JS_FreeValue(ctx, element);
    return -1;
}